

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::ImportFile(char16 *filename,bool allowNonExistingFile)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  undefined4 *puVar4;
  char *buffer;
  char *t;
  char *record;
  char16_t *pcStack_278;
  DWORD recordLen;
  char16 *name;
  uint local_268;
  DWORD len;
  uint i;
  DWORD recordCount;
  DWORD version;
  DWORD magic;
  char16 error_string [256];
  uint local_3c;
  undefined1 local_38 [4];
  errno_t e;
  DynamicProfileStorageReaderWriter reader;
  bool allowNonExistingFile_local;
  char16 *filename_local;
  
  reader._23_1_ = allowNonExistingFile;
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x1f0,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_38);
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)local_38,filename,L"rb",false,
                     (errno_t *)&local_3c);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)local_38,&recordCount);
    if (((bVar2) &&
        (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                           ((DynamicProfileStorageReaderWriter *)local_38,&i), bVar2)) &&
       (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                          ((DynamicProfileStorageReaderWriter *)local_38,&len), bVar2)) {
      if (recordCount == 0x132b5ae) {
        if (i == 2) {
          for (local_268 = 0; local_268 < len; local_268 = local_268 + 1) {
            bVar2 = DynamicProfileStorageReaderWriter::ReadUtf8String
                              ((DynamicProfileStorageReaderWriter *)local_38,
                               &stack0xfffffffffffffd88,(DWORD *)((long)&name + 4));
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x22b,"(false)","false");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
              filename_local._7_1_ = false;
              goto LAB_00dba248;
            }
            bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                              ((DynamicProfileStorageReaderWriter *)local_38,
                               (uint *)((long)&record + 4));
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x232,"(false)","false");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
              filename_local._7_1_ = false;
              goto LAB_00dba248;
            }
            buffer = AllocRecord(record._4_4_);
            if (buffer == (char *)0x0) {
              Output::Print(L"ERROR: DynamicProfileStorage: Out of memory importing \'%s\'\n",
                            filename);
              Output::Flush();
              Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
                        ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,
                         (ulong)(name._4_4_ + 1),pcStack_278);
              filename_local._7_1_ = false;
              goto LAB_00dba248;
            }
            t = GetRecordBuffer(buffer);
            bVar2 = DynamicProfileStorageReaderWriter::ReadArray<char>
                              ((DynamicProfileStorageReaderWriter *)local_38,t,(ulong)record._4_4_);
            if (!bVar2) {
              Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
                        ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,
                         (ulong)(name._4_4_ + 1),pcStack_278);
              DeleteRecord(buffer);
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x243,"(false)","false");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
              filename_local._7_1_ = false;
              goto LAB_00dba248;
            }
            SaveRecord(pcStack_278,buffer);
            Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
                      ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,
                       (ulong)(name._4_4_ + 1),pcStack_278);
          }
          bVar2 = DoTrace();
          if (bVar2) {
            Output::Print(L"TRACE: DynamicProfileStorage: Imported file: \'%s\'\n",filename);
            Output::Flush();
          }
          DVar3 = JsUtil::
                  BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  ::Count(&infoMap);
          if (len != DVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x253,"(recordCount == (uint)infoMap.Count())",
                               "failed to read all the records");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          filename_local._7_1_ = true;
        }
        else if ((reader._23_1_ & 1) == 0) {
          Output::Print(L"ERROR: DynamicProfileStorage: \'%s\' has format version %d; version %d expected"
                        ,filename,(ulong)i,2);
          Output::Flush();
          filename_local._7_1_ = false;
        }
        else {
          filename_local._7_1_ = true;
        }
      }
      else {
        Output::Print(L"ERROR: DynamicProfileStorage: \'%s\' is not a dynamic profile data file",
                      filename);
        Output::Flush();
        filename_local._7_1_ = false;
      }
    }
    else {
      filename_local._7_1_ = false;
    }
  }
  else if ((reader._23_1_ & 1) == 0) {
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Print(L"ERROR: DynamicProfileStorage: Unable to open file \'%s\' to import (%d)\n",
                    filename,(ulong)local_3c);
      _wcserror_s<256ul>((char16 (*) [256])&version,local_3c);
      Output::Print(L"ERROR:   For file \'%s\': %s (%d)\n",filename,&version,(ulong)local_3c);
      Output::Flush();
    }
    filename_local._7_1_ = false;
  }
  else {
    filename_local._7_1_ = true;
  }
LAB_00dba248:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)local_38);
  return filename_local._7_1_;
}

Assistant:

bool DynamicProfileStorage::ImportFile(__in_z char16 const * filename, bool allowNonExistingFile)
{
    AssertOrFailFast(enabled);
    DynamicProfileStorageReaderWriter reader;
    errno_t e;
    if (!reader.Init(filename, _u("rb"), false, &e))
    {
        if (allowNonExistingFile)
        {
            return true;
        }
        else
        {
            if (Js::Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("ERROR: DynamicProfileStorage: Unable to open file '%s' to import (%d)\n"), filename, e);

                char16 error_string[256];
                _wcserror_s(error_string, e);
                Output::Print(_u("ERROR:   For file '%s': %s (%d)\n"), filename, error_string, e);
                Output::Flush();
            }
            return false;
        }
    }

    DWORD magic;
    DWORD version;
    DWORD recordCount;
    if (!reader.Read(&magic)
        || !reader.Read(&version)
        || !reader.Read(&recordCount))
    {
        return false;
    }

    if (magic != MagicNumber)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: '%s' is not a dynamic profile data file"), filename);
        Output::Flush();
        return false;
    }
    if (version != FileFormatVersion)
    {
        if (allowNonExistingFile)
        {
            // Treat version mismatch as non-existent file
            return true;
        }
        Output::Print(_u("ERROR: DynamicProfileStorage: '%s' has format version %d; version %d expected"), filename,
            version, FileFormatVersion);
        Output::Flush();
        return false;
    }

    for (uint i = 0; i < recordCount; i++)
    {
        DWORD len;
        char16 * name;
        if (!reader.ReadUtf8String(&name, &len))
        {
            AssertOrFailFast(false);
            return false;
        }

        DWORD recordLen;
        if (!reader.Read(&recordLen))
        {
            AssertOrFailFast(false);
            return false;
        }

        char * record = AllocRecord(recordLen);
        if (record == nullptr)
        {
            Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory importing '%s'\n"), filename);
            Output::Flush();
            NoCheckHeapDeleteArray(len + 1, name);
            return false;
        }

        if (!reader.ReadArray(GetRecordBuffer(record), recordLen))
        {
            NoCheckHeapDeleteArray(len + 1, name);
            DeleteRecord(record);
            AssertOrFailFast(false);
            return false;
        }

        SaveRecord(name, record);

        // Save record will make a copy of the name
        NoCheckHeapDeleteArray(len + 1, name);
    }
#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Imported file: '%s'\n"), filename);
        Output::Flush();
    }
#endif
    AssertOrFailFastMsg(recordCount == (uint)infoMap.Count(), "failed to read all the records");
    return true;
}